

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void EscapeParam(char *pDst,char *pSrc,int size)

{
  int i;
  int size_local;
  char *pSrc_local;
  char *pDst_local;
  
  pSrc_local = pSrc;
  pDst_local = pDst;
  for (i = 0; *pSrc_local != '\0' && i < size + -1; i = i + 1) {
    if ((*pSrc_local == '\"') || (*pSrc_local == '\\')) {
      *pDst_local = '\\';
      pDst_local = pDst_local + 1;
    }
    *pDst_local = *pSrc_local;
    pSrc_local = pSrc_local + 1;
    pDst_local = pDst_local + 1;
  }
  *pDst_local = '\0';
  return;
}

Assistant:

void EscapeParam(char *pDst, const char *pSrc, int size)
{
	for(int i = 0; *pSrc && i < size - 1; ++i)
	{
		if(*pSrc == '"' || *pSrc == '\\') // escape \ and "
			*pDst++ = '\\';
		*pDst++ = *pSrc++;
	}
	*pDst = 0;
}